

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O0

bool libwebm::vttdemux::WriteFiles(metadata_map_t *m,Segment *s)

{
  bool bVar1;
  byte local_29;
  Cluster *local_28;
  Cluster *cluster;
  Segment *s_local;
  metadata_map_t *m_local;
  
  InitializeFiles(m);
  bVar1 = WriteChaptersFile(m,s);
  if (bVar1) {
    local_28 = mkvparser::Segment::GetFirst(s);
    while( true ) {
      local_29 = 0;
      if (local_28 != (Cluster *)0x0) {
        bVar1 = mkvparser::Cluster::EOS(local_28);
        local_29 = bVar1 ^ 0xff;
      }
      if ((local_29 & 1) == 0) {
        return true;
      }
      bVar1 = ProcessCluster(m,local_28);
      if (!bVar1) break;
      local_28 = mkvparser::Segment::GetNext(s,local_28);
    }
  }
  return false;
}

Assistant:

bool vttdemux::WriteFiles(const metadata_map_t& m, mkvparser::Segment* s) {
  // First write the WebVTT header.

  InitializeFiles(m);

  if (!WriteChaptersFile(m, s))
    return false;

  // Now iterate over the clusters, writing the WebVTT cue as we parse
  // each metadata block.

  const mkvparser::Cluster* cluster = s->GetFirst();

  while (cluster != NULL && !cluster->EOS()) {
    if (!ProcessCluster(m, cluster))
      return false;

    cluster = s->GetNext(cluster);
  }

  return true;
}